

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O1

int ucstricmp8(char *utf8,char *utf8end,QChar *utf16,QChar *utf16end)

{
  byte bVar1;
  char16_t cVar2;
  bool bVar3;
  QChar *pQVar4;
  char32_t cVar5;
  char32_t cVar6;
  
  do {
    if ((utf8end <= utf8) || (utf16end <= utf16)) {
      return (uint)(utf8 < utf8end) - (uint)(utf16 < utf16end);
    }
    bVar1 = *utf8;
    cVar6 = (char32_t)bVar1;
    if ((char)bVar1 < '\0') {
      bVar3 = true;
      cVar6 = L'\xaaaaaaaa';
      if ((((0xc1 < bVar1) && (0xdf < bVar1)) && (0xef < bVar1)) && (0xf4 < bVar1)) {
        bVar3 = true;
      }
    }
    else {
      bVar3 = false;
    }
    cVar5 = L'�';
    if (!bVar3) {
      cVar5 = QChar::toCaseFolded(cVar6);
    }
    pQVar4 = utf16 + 1;
    cVar2 = utf16->ucs;
    cVar6 = (char32_t)(ushort)cVar2;
    if ((((cVar2 & 0xf800U) == 0xd800) && (cVar6 = L'�', (cVar2 & 0xdc00U) == 0xd800)) &&
       ((pQVar4 < utf16end && ((pQVar4->ucs & 0xfc00U) == 0xdc00)))) {
      cVar6 = (uint)(ushort)cVar2 * 0x400 + (uint)(ushort)pQVar4->ucs + L'\xfca02400';
      pQVar4 = utf16 + 2;
    }
    utf16 = pQVar4;
    cVar6 = QChar::toCaseFolded(cVar6);
    utf8 = (char *)((byte *)utf8 + 1);
  } while (cVar5 - cVar6 == 0);
  return cVar5 - cVar6;
}

Assistant:

Q_NEVER_INLINE static int ucstricmp8(const char *utf8, const char *utf8end, const QChar *utf16, const QChar *utf16end)
{
    auto src1 = reinterpret_cast<const uchar *>(utf8);
    auto end1 = reinterpret_cast<const uchar *>(utf8end);
    QStringIterator src2(utf16, utf16end);

    while (src1 < end1 && src2.hasNext()) {
        char32_t decoded[1];
        char32_t *output = decoded;
        char32_t &uc1 = decoded[0];
        uchar b = *src1++;
        const qsizetype res = QUtf8Functions::fromUtf8<QUtf8BaseTraits>(b, output, src1, end1);
        if (res < 0) {
            // decoding error
            uc1 = QChar::ReplacementCharacter;
        } else {
            uc1 = QChar::toCaseFolded(uc1);
        }

        char32_t uc2 = QChar::toCaseFolded(src2.next());
        int diff = uc1 - uc2;   // can't underflow
        if (diff)
            return diff;
    }

    // the shorter string sorts first
    return (end1 > src1) - int(src2.hasNext());
}